

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,wstring *s1,wstring *s2)

{
  size_t __n;
  int iVar1;
  wstring *this_00;
  
  __n = s1->_M_string_length;
  if (__n == s2->_M_string_length) {
    if (__n != 0) {
      iVar1 = wmemcmp((s1->_M_dataplus)._M_p,(s2->_M_dataplus)._M_p,__n);
      if (iVar1 != 0) goto LAB_00156664;
    }
    freopen((char *)0x0,"w",_stdout);
    wprintf(L"%ls OK",(strCase->_M_dataplus)._M_p);
    wprintf(L"\n");
    return;
  }
LAB_00156664:
  freopen((char *)0x0,"w",_stdout);
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",(strCase->_M_dataplus)._M_p,(s1->_M_dataplus)._M_p
          ,(s2->_M_dataplus)._M_p);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::wstring &s1, const std::wstring &s2) {
  if (s1 != s2) {
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
           dmpPrintable(strCase), dmpPrintable(s1), dmpPrintable(s2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}